

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall Equality_parseMath_Test::~Equality_parseMath_Test(Equality_parseMath_Test *this)

{
  Equality_parseMath_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(Equality, parseMath)
{
    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(fileContents("deriv_approx_sin.xml"));

    libcellml::ComponentPtr component = libcellml::Component::create("sin");

    libcellml::VariablePtr x = libcellml::Variable::create("x");
    x->setUnits("dimensionless");
    x->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE);

    libcellml::VariablePtr sin_initial_value = libcellml::Variable::create("sin_initial_value");
    sin_initial_value->setUnits("dimensionless");
    sin_initial_value->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE);

    libcellml::VariablePtr sin = libcellml::Variable::create("sin");
    sin->setUnits("dimensionless");
    sin->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE);
    sin->setInitialValue(sin_initial_value);

    component->setMath(
        "<math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "      <apply><eq/>\n"
        "        <apply><diff/>\n"
        "          <bvar><ci>x</ci></bvar>\n"
        "          <ci>sin</ci>\n"
        "        </apply>\n"
        "        <apply><cos/>\n"
        "          <ci>x</ci>\n"
        "        </apply>\n"
        "      </apply>\n"
        "    </math>\n");

    EXPECT_TRUE(x->equals(model->component(0)->variable("x")));
    EXPECT_TRUE(sin_initial_value->equals(model->component(0)->variable("sin_initial_value")));
    EXPECT_TRUE(sin->equals(model->component(0)->variable("sin")));

    EXPECT_TRUE(component->equals(model->component(0)));
}